

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O3

void __thiscall
cbtGImpactMeshShape::cbtGImpactMeshShape
          (cbtGImpactMeshShape *this,cbtStridingMeshInterface *meshInterface)

{
  cbtGImpactShapeInterface::cbtGImpactShapeInterface(&this->super_cbtGImpactShapeInterface);
  (this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
  _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtGImpactMeshShape_00b4c718;
  (this->m_mesh_parts).m_ownsMemory = true;
  (this->m_mesh_parts).m_data = (cbtGImpactMeshShapePart **)0x0;
  (this->m_mesh_parts).m_size = 0;
  (this->m_mesh_parts).m_capacity = 0;
  this->m_meshInterface = meshInterface;
  buildMeshParts(this,meshInterface);
  return;
}

Assistant:

cbtGImpactMeshShape(cbtStridingMeshInterface* meshInterface)
	{
		m_meshInterface = meshInterface;
		buildMeshParts(meshInterface);
	}